

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::FieldTypeNameDebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  Type TVar1;
  Descriptor *pDVar2;
  allocator local_11;
  
  TVar1 = type(this);
  if (TVar1 == TYPE_ENUM) {
    pDVar2 = (Descriptor *)enum_type(this);
  }
  else {
    if (TVar1 != TYPE_MESSAGE) {
      TVar1 = type(this);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,*(char **)(kTypeToName + (ulong)TVar1 * 8),
                 &local_11);
      return __return_storage_ptr__;
    }
    pDVar2 = message_type(this);
  }
  std::operator+(__return_storage_ptr__,".",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)(pDVar2 + 8) + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::FieldTypeNameDebugString() const {
  switch (type()) {
    case TYPE_MESSAGE:
      return "." + message_type()->full_name();
    case TYPE_ENUM:
      return "." + enum_type()->full_name();
    default:
      return kTypeToName[type()];
  }
}